

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O0

void duckdb::MapExtractValueFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  LogicalTypeId LVar1;
  bool bVar2;
  LogicalType *pLVar3;
  int *piVar4;
  list_entry_t *plVar5;
  idx_t iVar6;
  idx_t iVar7;
  Vector *in_RDX;
  DataChunk *in_RDI;
  unsigned_long pos;
  idx_t pos_idx;
  idx_t lst_idx;
  idx_t row_idx;
  ValidityMask *result_validity;
  list_entry_t *inc_list_data;
  int *pos_data;
  UnifiedVectorFormat lst_format;
  UnifiedVectorFormat pos_format;
  Vector pos_vec;
  Vector *val_vec;
  Vector *key_vec;
  bool arg_is_null;
  bool map_is_null;
  value_type *arg_vec;
  value_type *map_vec;
  idx_t count;
  Vector *in_stack_fffffffffffffdf8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  idx_t in_stack_fffffffffffffe78;
  UnifiedVectorFormat *idx;
  Vector *in_stack_fffffffffffffe80;
  Vector *in_stack_fffffffffffffe88;
  Vector *in_stack_fffffffffffffe90;
  SelectionVector *in_stack_fffffffffffffe98;
  SelectionVector *local_120 [11];
  LogicalType local_c8 [24];
  Vector local_b0 [104];
  Vector *local_48;
  undefined8 local_40;
  undefined1 local_32;
  byte local_31;
  reference local_30;
  Vector *local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = (UnifiedVectorFormat *)DataChunk::size(in_RDI);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe00,
                        (size_type)in_stack_fffffffffffffdf8);
  local_30 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe00,
                        (size_type)in_stack_fffffffffffffdf8);
  pLVar3 = Vector::GetType(local_28);
  LVar1 = LogicalType::id(pLVar3);
  local_31 = LVar1 == SQLNULL;
  pLVar3 = Vector::GetType(local_30);
  LVar1 = LogicalType::id(pLVar3);
  local_32 = LVar1 == SQLNULL;
  if (((local_31 & 1) != 0) || ((bool)local_32)) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    duckdb::ConstantVector::SetNull(local_18,true);
    duckdb::Vector::Verify((ulong)local_18);
  }
  else {
    local_40 = duckdb::MapVector::GetKeys(local_28);
    local_48 = (Vector *)duckdb::MapVector::GetValues(local_28);
    duckdb::LogicalType::LogicalType(local_c8,INTEGER);
    duckdb::Vector::Vector(local_b0,local_c8,local_20);
    duckdb::LogicalType::~LogicalType(local_c8);
    DataChunk::size(local_8);
    ListSearchOp<true>((Vector *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                       in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                      );
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_120);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)&stack0xfffffffffffffe98);
    duckdb::Vector::ToUnifiedFormat((ulong)local_b0,local_20);
    duckdb::Vector::ToUnifiedFormat((ulong)local_28,local_20);
    piVar4 = UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)local_120);
    plVar5 = ListVector::GetData(in_stack_fffffffffffffdf8);
    FlatVector::Validity((Vector *)0xd990d9);
    for (idx = (UnifiedVectorFormat *)0x0; idx < local_20; idx = idx + 1) {
      iVar6 = SelectionVector::get_index(in_stack_fffffffffffffe98,(idx_t)idx);
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)
                         CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                         (idx_t)in_stack_fffffffffffffe00);
      if (bVar2) {
        iVar7 = SelectionVector::get_index(local_120[0],(idx_t)idx);
        in_stack_fffffffffffffe0f =
             TemplatedValidityMask<unsigned_long>::RowIsValid
                       ((TemplatedValidityMask<unsigned_long> *)
                        CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                        (idx_t)in_stack_fffffffffffffe00);
        if ((bool)in_stack_fffffffffffffe0f) {
          in_stack_fffffffffffffdf8 = (Vector *)plVar5[iVar6].offset;
          in_stack_fffffffffffffe00 =
               (TemplatedValidityMask<unsigned_long> *)
               UnsafeNumericCast<unsigned_long,int,void>(piVar4[iVar7] + -1);
          duckdb::VectorOperations::Copy
                    (local_48,local_18,
                     (ulong)(in_stack_fffffffffffffdf8 + (long)in_stack_fffffffffffffe00 + 1),
                     (ulong)(in_stack_fffffffffffffdf8 + (long)in_stack_fffffffffffffe00),(ulong)idx
                    );
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (in_stack_fffffffffffffe00,(idx_t)in_stack_fffffffffffffdf8);
        }
      }
      else {
        duckdb::FlatVector::SetNull(local_18,(ulong)idx,true);
      }
    }
    iVar6 = DataChunk::size(local_8);
    if (iVar6 == 1) {
      duckdb::Vector::SetVectorType((VectorType)local_18);
    }
    duckdb::Vector::Verify((ulong)local_18);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe00);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe00);
    Vector::~Vector((Vector *)in_stack_fffffffffffffe00);
  }
  return;
}

Assistant:

static void MapExtractValueFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);

	auto &result_validity = FlatVector::Validity(result);
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return NULL
			result_validity.SetInvalid(row_idx);
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list_data[lst_idx].offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		VectorOperations::Copy(val_vec, result, pos + 1, pos, row_idx);
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}